

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O0

void __thiscall zmq::xsub_t::xsub_t(xsub_t *this,ctx_t *parent_,uint32_t tid_,int sid_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDI;
  char *errstr;
  int rc;
  ctx_t *in_stack_00000068;
  socket_base_t *in_stack_00000070;
  fq_t *in_stack_ffffffffffffffa0;
  msg_t *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  socket_base_t::socket_base_t
            (in_stack_00000070,in_stack_00000068,this._4_4_,(int)this,parent_._7_1_);
  *in_RDI = &PTR__xsub_t_003e7408;
  in_RDI[0xad] = &DAT_003e7578;
  in_RDI[0xaf] = &PTR__xsub_t_003e7598;
  in_RDI[0xb0] = &PTR__xsub_t_003e75d0;
  fq_t::fq_t(in_stack_ffffffffffffffa0);
  dist_t::dist_t((dist_t *)in_stack_ffffffffffffffa0);
  radix_tree_t::radix_tree_t((radix_tree_t *)in_stack_ffffffffffffffa0);
  *(undefined1 *)(in_RDI + 0xed) = 0;
  this_00 = (msg_t *)(in_RDI + 0xee);
  *(undefined1 *)(in_RDI + 0xf6) = 0;
  *(undefined1 *)((long)in_RDI + 0x7b1) = 0;
  *(undefined1 *)((long)in_RDI + 0x7b2) = 0;
  *(undefined1 *)((long)in_RDI + 0x7b3) = 0;
  *(undefined1 *)((long)in_RDI + 0x14c) = 10;
  ctx = (EVP_PKEY_CTX *)0x0;
  atomic_value_t::store
            ((atomic_value_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (int)((ulong)this_00 >> 0x20));
  iVar1 = msg_t::init(this_00,ctx);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
            ,0x34);
    fflush(_stderr);
    zmq_abort((char *)0x2eab3a);
  }
  return;
}

Assistant:

zmq::xsub_t::xsub_t (class ctx_t *parent_, uint32_t tid_, int sid_) :
    socket_base_t (parent_, tid_, sid_),
    _has_message (false),
    _more_send (false),
    _more_recv (false),
    _process_subscribe (false),
    _only_first_subscribe (false)
{
    options.type = ZMQ_XSUB;

    //  When socket is being closed down we don't want to wait till pending
    //  subscription commands are sent to the wire.
    options.linger.store (0);

    const int rc = _message.init ();
    errno_assert (rc == 0);
}